

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

bool __thiscall
jsoncons::jsonpath::detail::
token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::is_right_associative
          (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this)

{
  jsonpath_token_kind jVar1;
  assertion_error *paVar2;
  unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *puVar3;
  allocator<char> local_31;
  string local_30;
  
  jVar1 = this->token_kind_;
  if (jVar1 == binary_operator) {
    puVar3 = (this->field_1).unary_operator_;
    if (puVar3 == (unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)0x0) {
      paVar2 = (assertion_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"assertion \'binary_operator_ != nullptr\' failed at  <> :0",
                 &local_31);
      assertion_error::assertion_error(paVar2,&local_30);
      __cxa_throw(paVar2,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (jVar1 != unary_operator) {
      if (jVar1 != selector) {
        return false;
      }
      if ((this->field_1).selector_ != (selector_type *)0x0) {
        return true;
      }
      paVar2 = (assertion_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"assertion \'selector_ != nullptr\' failed at  <> :0",&local_31
                );
      assertion_error::assertion_error(paVar2,&local_30);
      __cxa_throw(paVar2,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
    puVar3 = (this->field_1).unary_operator_;
    if (puVar3 == (unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)0x0) {
      paVar2 = (assertion_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"assertion \'unary_operator_ != nullptr\' failed at  <> :0",
                 &local_31);
      assertion_error::assertion_error(paVar2,&local_30);
      __cxa_throw(paVar2,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return puVar3->is_right_associative_;
}

Assistant:

bool is_right_associative() const
        {
            switch(token_kind_)
            {
                case jsonpath_token_kind::selector:
                    JSONCONS_ASSERT(selector_ != nullptr);
                    return selector_->is_right_associative();
                case jsonpath_token_kind::unary_operator:
                    JSONCONS_ASSERT(unary_operator_ != nullptr);
                    return unary_operator_->is_right_associative();
                case jsonpath_token_kind::binary_operator:
                    JSONCONS_ASSERT(binary_operator_ != nullptr);
                    return binary_operator_->is_right_associative();
                default:
                    return false;
            }
        }